

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_define_array.hpp
# Opt level: O0

void msgpack::v1::type::
     define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_3UL>
     ::unpack(object *o,
             tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             *t)

{
  object *o_00;
  object *in_RSI;
  long in_RDI;
  size_t size;
  int *in_stack_ffffffffffffffd8;
  tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
  *in_stack_ffffffffffffffe8;
  
  define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_2UL>
  ::unpack(in_RSI,in_stack_ffffffffffffffe8);
  if (2 < *(uint *)(in_RDI + 8)) {
    o_00 = (object *)(*(long *)(in_RDI + 0x10) + 0x30);
    std::get<2ul,int&,std::__cxx11::string&,int&>
              ((tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
                *)0x2a70e0);
    convert_helper<int>(o_00,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void unpack(msgpack::object const& o, Tuple& t) {
        define_array_imp<Tuple, N-1>::unpack(o, t);
        const size_t size = o.via.array.size;
        if(size <= N-1) { return; }
        convert_helper(o.via.array.ptr[N-1], std::get<N-1>(t));
    }